

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O3

int ptls_hpke_setup_base_s
              (ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,ptls_iovec_t *pk_s,
              ptls_aead_context_t **ctx,ptls_iovec_t pk_r,ptls_iovec_t info)

{
  ptls_iovec_t dh;
  ptls_iovec_t info_00;
  ptls_aead_context_t **ctx_00;
  int iVar1;
  uint8_t *__ptr;
  ptls_iovec_t pk_s_00;
  uint8_t secret [64];
  size_t sVar2;
  ptls_iovec_t local_a8;
  ptls_hpke_kem_t *local_90;
  ptls_hpke_cipher_suite_t *local_88;
  ptls_aead_context_t **local_80;
  undefined1 local_78 [72];
  
  local_a8.base = (uint8_t *)0x0;
  local_a8.len = 0;
  pk_s->base = (uint8_t *)0x0;
  pk_s->len = 0;
  local_80 = ctx;
  iVar1 = (*kem->keyex->exchange)(kem->keyex,pk_s,&local_a8,pk_r);
  ctx_00 = local_80;
  if (iVar1 == 0) {
    dh.len = local_a8.len;
    dh.base = local_a8.base;
    pk_s_00.len = pk_s->len;
    pk_s_00.base = pk_s->base;
    sVar2 = local_a8.len;
    local_90 = kem;
    local_88 = cipher;
    iVar1 = dh_derive(kem,local_78,pk_s_00,pk_r,dh);
    if (local_a8.base != (uint8_t *)0x0) {
      (*ptls_clear_memory)(local_a8.base,local_a8.len);
      free(local_a8.base);
    }
    if (iVar1 == 0) {
      info_00.len = sVar2;
      info_00.base = (uint8_t *)info.len;
      iVar1 = key_schedule(local_90,local_88,ctx_00,1,local_78,info_00);
      if (iVar1 == 0) {
        iVar1 = 0;
        goto LAB_0010de0a;
      }
      if (pk_s->len == 0) goto LAB_0010de0a;
      (*ptls_clear_memory)(pk_s->base,pk_s->len);
    }
    __ptr = pk_s->base;
  }
  else {
    if (pk_s->base != (uint8_t *)0x0) {
      __assert_fail("pk_s->base == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/hpke.c"
                    ,0x85,"int dh_encap(ptls_hpke_kem_t *, void *, ptls_iovec_t *, ptls_iovec_t)");
    }
    if (local_a8.base != (uint8_t *)0x0) {
      __assert_fail("dh.base == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/hpke.c"
                    ,0x86,"int dh_encap(ptls_hpke_kem_t *, void *, ptls_iovec_t *, ptls_iovec_t)");
    }
    __ptr = (uint8_t *)0x0;
  }
  free(__ptr);
  pk_s->base = (uint8_t *)0x0;
  pk_s->len = 0;
LAB_0010de0a:
  (*ptls_clear_memory)(local_78,0x40);
  return iVar1;
}

Assistant:

int ptls_hpke_setup_base_s(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_iovec_t *pk_s, ptls_aead_context_t **ctx,
                           ptls_iovec_t pk_r, ptls_iovec_t info)
{
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    *pk_s = ptls_iovec_init(NULL, 0);

    if ((ret = dh_encap(kem, secret, pk_s, pk_r)) != 0)
        goto Exit;

    if ((ret = key_schedule(kem, cipher, ctx, 1, secret, info)) != 0)
        goto Exit;

Exit:
    if (ret != 0 && pk_s->len != 0) {
        ptls_clear_memory(pk_s->base, pk_s->len);
        free(pk_s->base);
        *pk_s = ptls_iovec_init(NULL, 0);
    }
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}